

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O0

void __thiscall docs::DocsParser::createDoc(DocsParser *this,Doc *doc)

{
  TokenKind TVar1;
  LexData *pLVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  Token *pTVar6;
  reference pvVar7;
  bool local_34f;
  bool local_34d;
  DocSection local_2e8;
  undefined1 local_260 [8];
  string id;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  string type;
  Token firstTok;
  string local_1b8;
  DocSection local_198;
  undefined1 local_110 [8];
  Token id_tok;
  string local_f0;
  DocSection local_d0;
  char *local_48;
  undefined1 local_40 [8];
  Token idTok;
  Token commentTok;
  Doc *doc_local;
  DocsParser *this_local;
  
  while( true ) {
    do {
      pTVar6 = next_token(this);
      if (pTVar6->kind == Eof) {
        return;
      }
      bVar5 = is(this,Comment);
    } while (!bVar5);
    idTok.i = (this->tok).kind;
    idTok.j = (this->tok).pos.line;
    pTVar6 = next_token(this);
    iVar4 = (pTVar6->pos).line;
    (this->tok).kind = pTVar6->kind;
    (this->tok).pos.line = iVar4;
    *(undefined8 *)&(this->tok).pos.col = *(undefined8 *)&(pTVar6->pos).col;
    (this->tok).j = pTVar6->j;
    bVar5 = eof(this);
    if (bVar5) break;
    TVar1 = (this->tok).kind;
    if (TVar1 == Identifier) {
      type.field_2._8_4_ = (this->tok).kind;
      type.field_2._12_4_ = (this->tok).pos.line;
      std::__cxx11::string::string((string *)local_1f8);
      pTVar6 = next_token(this);
      (this->tok).j = pTVar6->j;
      iVar4 = (pTVar6->pos).line;
      uVar3 = *(undefined8 *)&(pTVar6->pos).col;
      (this->tok).kind = pTVar6->kind;
      (this->tok).pos.line = iVar4;
      *(undefined8 *)&(this->tok).pos.col = uVar3;
      bVar5 = Token::is_double_colon(&this->tok);
      if (bVar5) {
        std::__cxx11::string::operator+=((string *)local_1f8,"::");
        pTVar6 = next_token(this);
        iVar4 = (pTVar6->pos).line;
        (this->tok).kind = pTVar6->kind;
        (this->tok).pos.line = iVar4;
        *(undefined8 *)&(this->tok).pos.col = *(undefined8 *)&(pTVar6->pos).col;
        (this->tok).j = pTVar6->j;
      }
      bVar5 = is(this,Identifier);
      if (!bVar5) {
        error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
      }
      LexData::id_text_abi_cxx11_(&local_218,this->data,&this->tok);
      std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      next_token(this);
      while (bVar5 = Token::is_double_colon(&this->tok), bVar5) {
        std::__cxx11::string::operator+=((string *)local_1f8,"::");
        next_token(this);
        bVar5 = is(this,Identifier);
        if (!bVar5) {
          error<char_const(&)[30]>(this,(char (*) [30])"expecting identifier after ::");
        }
        LexData::id_text_abi_cxx11_(&local_238,this->data,&this->tok);
        std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        next_token(this);
      }
      while( true ) {
        bVar5 = eof(this);
        local_34d = false;
        if (!bVar5) {
          bVar5 = is(this,Punctuator);
          if ((!bVar5) ||
             ((((this->tok).i != 0x2a || (local_34f = true, (this->tok).j != 0)) &&
              (((this->tok).i != 0x26 || (local_34f = true, (this->tok).j != 0)))))) {
            local_34f = Token::is_const_keyword(&this->tok);
          }
          local_34d = local_34f;
        }
        if (local_34d == false) break;
        bVar5 = is(this,Keyword);
        if (bVar5) {
          std::__cxx11::string::push_back((char)local_1f8);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&keywords_id_abi_cxx11_,(long)(this->tok).i);
          std::__cxx11::string::operator+=((string *)local_1f8,(string *)pvVar7);
        }
        else {
          std::__cxx11::string::push_back((char)local_1f8);
        }
        next_token(this);
      }
      bVar5 = is(this,Identifier);
      if (!bVar5) {
        id.field_2._8_8_ = std::__cxx11::string::c_str();
        error<char_const(&)[35],char_const*>
                  (this,(char (*) [35])"expecting identifier after type %s",
                   (char **)((long)&id.field_2 + 8));
      }
      LexData::id_text_abi_cxx11_((string *)local_260,this->data,&this->tok);
      make_section(&local_2e8,this->data,(Token *)&idTok.i,(string *)local_260,(string *)local_1f8);
      std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::push_back
                (&doc->sections,&local_2e8);
      DocSection::~DocSection(&local_2e8);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    else if (TVar1 == Keyword) {
      switch((this->tok).i) {
      case 3:
      case 4:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0x11:
      case 0x14:
      case 0x15:
      case 0x1b:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x23:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x34:
      case 0x38:
      case 0x39:
      case 0x3b:
      case 0x40:
      case 0x42:
      case 0x46:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
        pTVar6 = next_token(this);
        local_110._0_4_ = pTVar6->kind;
        local_110._4_4_ = (pTVar6->pos).line;
        id_tok._0_8_ = *(undefined8 *)&(pTVar6->pos).col;
        id_tok.pos.col = pTVar6->j;
        bVar5 = is(this,Identifier);
        if (!bVar5) {
          error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
        }
        pLVar2 = this->data;
        LexData::id_text_abi_cxx11_(&local_1b8,pLVar2,(Token *)local_110);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&keywords_id_abi_cxx11_,(long)(this->tok).i);
        make_section(&local_198,pLVar2,(Token *)&idTok.i,&local_1b8,pvVar7);
        std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::push_back
                  (&doc->sections,&local_198);
        DocSection::~DocSection(&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        break;
      case 0xc:
      case 0x1e:
      case 0x2c:
      case 0x3e:
      case 0x49:
        pTVar6 = next_token(this);
        local_40._0_4_ = pTVar6->kind;
        local_40._4_4_ = (pTVar6->pos).line;
        idTok._0_8_ = *(undefined8 *)&(pTVar6->pos).col;
        idTok.pos.col = pTVar6->j;
        bVar5 = is(this,Identifier);
        if (bVar5) {
          pLVar2 = this->data;
          LexData::id_text_abi_cxx11_(&local_f0,pLVar2,(Token *)local_40);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&keywords_id_abi_cxx11_,(long)(this->tok).i);
          make_section(&local_d0,pLVar2,(Token *)&idTok.i,&local_f0,pvVar7);
          std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::push_back
                    (&doc->sections,&local_d0);
          DocSection::~DocSection(&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&keywords_id_abi_cxx11_,(long)(this->tok).i);
          local_48 = (char *)std::__cxx11::string::c_str();
          error<char_const(&)[30],char_const*>
                    (this,(char (*) [30])"expecting identifier after %s",&local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void createDoc(Doc& doc) {
    while (next_token().kind != TokenKind::Eof) {
      // Discard tokens until we find a comment, which might be
      // included in the docs.
      if (!is(TokenKind::Comment))
        continue;

      Token commentTok = tok;
      tok = next_token();
      if (eof()) // end of tokens (a comment at the end of file, maybe commenting the file?)
        break;

      switch (tok.kind) {
        case TokenKind::Keyword:
          switch (tok.i) {
            // Structures and namespaces
            case key_class:
            case key_struct:
            case key_enum:
            case key_union:
            case key_namespace: {
              Token idTok = next_token();
              if (!is(TokenKind::Identifier)) {
                error("expecting identifier after %s",
                      keywords_id[int(tok.i)].c_str());
                break;
              }

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(idTok),
                             keywords_id[int(tok.i)]));
              break;
            }
              // Variables or functions
            case key_auto:
            case key_bool:
            case key_char:
            case key_char16_t:
            case key_char32_t:
            case key_char8_t:
            case key_const:
            case key_constexpr:
            case key_constinit:
            case key_double:
            case key_explicit:
            case key_export:
            case key_extern:
            case key_float:
            case key_inline:
            case key_int:
            case key_long:
            case key_mutable:
            case key_register:
            case key_short:
            case key_signed:
            case key_static:
            case key_template:
            case key_thread_local:
            case key_typedef:
            case key_unsigned:
            case key_using:
            case key_virtual:
            case key_void:
            case key_volatile:
            case key_wchar_t: {
              Token id_tok = next_token();
              if (!is(TokenKind::Identifier))
                error("expecting identifier");

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(id_tok),
                             keywords_id[int(tok.i)]));
              break;
            }
          }
          break;
          // A user defined type to define a return value of a function or a variable type
        case TokenKind::Identifier: {
          Token firstTok = tok;
          std::string type;

          // TODO types that start with "const" go to the keyword
          //      case, or with "::" go to punctuator case

          tok = next_token();
          if (tok.is_double_colon()) {
            type += "::";
            tok = next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier");

          type += data.id_text(tok);
          next_token();

          while (tok.is_double_colon()) {
            type += "::";
            next_token();
            if (!is(TokenKind::Identifier))
              error("expecting identifier after ::");

            type += data.id_text(tok);
            next_token();
          }

          while (!eof() &&
                 // Pointers and references
                 ((is(TokenKind::Punctuator) &&
                   ((tok.i == '*' && tok.j == 0) ||
                    (tok.i == '&' && tok.j == 0)))
                  ||
                  // const
                  (tok.is_const_keyword()))) {
            if (is(TokenKind::Keyword)) {
              type.push_back(' ');
              type += keywords_id[tok.i];
            }
            else
              type.push_back(tok.i); // Add '*' or '&'
            next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier after type %s", type.c_str());

          std::string id(data.id_text(tok));

          doc.sections.push_back(
            make_section(data, commentTok, id, type));
          break;
        }
      }
    }
  }